

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_scan.c
# Opt level: O2

int IN_SCANSET(char *scanlist,char *end_scanlist,int rc)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0xffffffff;
  do {
    while( true ) {
      if (scanlist == end_scanlist) {
        return 0;
      }
      bVar1 = *scanlist;
      if (uVar4 != 0xffffffff && bVar1 == 0x2d) break;
      if ((uint)bVar1 == rc) {
        return 1;
      }
      scanlist = (char *)((byte *)scanlist + 1);
      uVar4 = (uint)bVar1;
    }
    scanlist = (char *)((byte *)scanlist + 1);
    if (scanlist == end_scanlist) {
      return (uint)(rc == 0x2d);
    }
    uVar3 = (byte)*scanlist - uVar4;
    if ((byte)*scanlist < uVar4) {
      uVar3 = 0;
    }
    uVar2 = ~uVar4;
    uVar4 = 0xffffffff;
  } while (uVar3 <= uVar2 + rc);
  return 1;
}

Assistant:

static int IN_SCANSET( const char * scanlist, const char * end_scanlist, int rc )
{
    /* SOLAR */
    int previous = -1;

    while ( scanlist != end_scanlist )
    {
        if ( ( *scanlist == '-' ) && ( previous != -1 ) )
        {
            /* possible scangroup ("a-z") */
            if ( ++scanlist == end_scanlist )
            {
                /* '-' at end of scanlist does not describe a scangroup */
                return rc == '-';
            }

            while ( ++previous <= ( unsigned char )*scanlist )
            {
                if ( previous == rc )
                {
                    return 1;
                }
            }

            previous = -1;
        }
        else
        {
            /* not a scangroup, check verbatim */
            if ( rc == ( unsigned char )*scanlist )
            {
                return 1;
            }

            previous = ( unsigned char )( *scanlist++ );
        }
    }

    return 0;
}